

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::GetOwnPropertyNoHostObjectForHeapEnum
              (Var instance,PropertyId propertyId,ScriptContext *requestContext,Var *getter,
              Var *setter)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  PropertyQueryFlags PVar5;
  undefined4 *puVar6;
  DynamicObject *this;
  Type *pTVar7;
  Type local_40;
  Var returnVar;
  
  bVar2 = VarIs<Js::RecyclableObject>(instance);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6ee,"(!TaggedNumber::Is(instance))",
                                "GetDataPropertyNoHostObject int passed");
    if (!bVar2) goto LAB_00ab7144;
    *puVar6 = 0;
  }
  returnVar._4_4_ = propertyId;
  BVar3 = HasOwnPropertyNoHostObjectForHeapEnum(instance,propertyId,requestContext,getter,setter);
  if (((BVar3 == 0) && (*getter == (Var)0x0)) && (*setter == (Var)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x6ef,
                                "(HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter)"
                                ,
                                "HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter"
                               );
    if (!bVar2) {
LAB_00ab7144:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  this = VarTo<Js::DynamicObject>(instance);
  *setter = (Var)0x0;
  *getter = (Var)0x0;
  if (this == (DynamicObject *)0x0) {
    return (((requestContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  local_40.ptr = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
  iVar4 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xf])(this);
  if (iVar4 == 0) {
    iVar4 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x15])
                      (this,(ulong)returnVar._4_4_,getter,setter,requestContext);
    if (iVar4 == 0) {
      PVar5 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x12])
                        (this,instance,(ulong)returnVar._4_4_,&local_40,0,requestContext);
      goto LAB_00ab711a;
    }
  }
  else {
    BVar3 = DynamicObject::GetAccessors(this,returnVar._4_4_,getter,setter,requestContext);
    if (BVar3 == 0) {
      PVar5 = DynamicObject::GetPropertyQuery
                        (this,instance,returnVar._4_4_,&local_40.ptr,(PropertyValueInfo *)0x0,
                         requestContext);
LAB_00ab711a:
      if (PVar5 == Property_Found) {
        pTVar7 = &local_40;
        goto LAB_00ab7132;
      }
    }
  }
  pTVar7 = &(((requestContext->super_ScriptContextBase).javascriptLibrary)->
            super_JavascriptLibraryBase).undefinedValue;
LAB_00ab7132:
  return pTVar7->ptr;
}

Assistant:

Var JavascriptOperators::GetOwnPropertyNoHostObjectForHeapEnum(Var instance, PropertyId propertyId, ScriptContext* requestContext, Var& getter, Var& setter)
    {
        AssertMsg(!TaggedNumber::Is(instance), "GetDataPropertyNoHostObject int passed");
        Assert(HasOwnPropertyNoHostObjectForHeapEnum(instance, propertyId, requestContext, getter, setter) || getter || setter);
        DynamicObject* dynamicObject = VarTo<DynamicObject>(instance);
        getter = setter = NULL;
        if (NULL == dynamicObject)
        {
            return requestContext->GetLibrary()->GetUndefined();
        }
        Var returnVar = requestContext->GetLibrary()->GetUndefined();
        BOOL result = FALSE;
        if (dynamicObject->UseDynamicObjectForNoHostObjectAccess())
        {
            if (! dynamicObject->DynamicObject::GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                result = JavascriptConversion::PropertyQueryFlagsToBoolean((dynamicObject->DynamicObject::GetPropertyQuery(instance, propertyId, &returnVar, NULL, requestContext)));
            }
        }
        else
        {
            if (! dynamicObject->GetAccessors(propertyId, &getter, &setter, requestContext))
            {
                result = dynamicObject->GetProperty(instance, propertyId, &returnVar, NULL, requestContext);
            }
        }

        if (result)
        {
            return returnVar;
        }
        return requestContext->GetLibrary()->GetUndefined();
    }